

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_new.cc
# Opt level: O1

void asn1_primitive_clear(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  if (it != (ASN1_ITEM *)0x0) {
    if (it->funcs != (void *)0x0) {
      __assert_fail("it == NULL || it->funcs == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_new.cc"
                    ,0x109,"void asn1_primitive_clear(ASN1_VALUE **, const ASN1_ITEM *)");
    }
    if ((it->itype != '\x05') && (it->utype == 1)) {
      *(int *)pval = (int)it->size;
      return;
    }
  }
  *pval = (ASN1_VALUE *)0x0;
  return;
}

Assistant:

static void asn1_primitive_clear(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  int utype;
  // Historically, |it->funcs| for primitive types contained an
  // |ASN1_PRIMITIVE_FUNCS| table of calbacks.
  assert(it == NULL || it->funcs == NULL);
  if (!it || (it->itype == ASN1_ITYPE_MSTRING)) {
    utype = -1;
  } else {
    utype = it->utype;
  }
  if (utype == V_ASN1_BOOLEAN) {
    *(ASN1_BOOLEAN *)pval = (ASN1_BOOLEAN)it->size;
  } else {
    *pval = NULL;
  }
}